

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  FunctionBody *functionBody;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var value;
  
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  value = JavascriptOperators::PatchGetMethod<false,Js::InlineCache>
                    (functionBody,inlineCache,playout->inlineCacheIndex,instance,propertyId);
  SetReg<unsigned_int>(this,playout->Value,value);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetMethodProperty_NoFastPath(Var instance, unaligned T *playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        Var value = JavascriptOperators::PatchGetMethod<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetMethodProperty(instance, propertyId, value, true);
        }
#endif

        SetReg(playout->Value, value);
    }